

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O1

void testBase(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  char **func;
  int patch;
  int minor;
  int major;
  char *extra;
  int local_34;
  int local_30;
  int local_2c;
  char *local_28;
  
  func = &local_28;
  exr_get_library_version(&local_2c,&local_30,&local_34);
  if (((local_2c == 3) && (local_30 == 4)) && (local_34 == 0)) {
    iVar1 = strcmp(local_28,"-dev");
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Testing OpenEXR library version: \'",0x22);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
      std::ostream::operator<<(poVar2,local_34);
      if (*local_28 != '\0') {
        sVar3 = strlen(local_28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_28,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      exr_get_library_version(0,&local_30,&local_34,&local_28);
      exr_get_library_version(&local_2c,0,&local_34,&local_28);
      exr_get_library_version(&local_2c,&local_30,0,&local_28);
      exr_get_library_version(&local_2c,&local_30,&local_34,0);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"ERROR testing library, wrong library version: \'",0x2f);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_2c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::ostream::operator<<(poVar2,local_34);
  if (*local_28 != '\0') {
    sVar3 = strlen(local_28);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_28,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\' vs compiled in \'",0x12);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::ostream::operator<<(poVar2,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"-dev",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  core_test_fail("false",(char *)0x2f,0x1830e4,(char *)func);
}

Assistant:

void
testBase (const std::string& tempdir)
{
    int         major, minor, patch;
    const char* extra;
    const char* compextra = COMP_EXTRA;

    exr_get_library_version (&major, &minor, &patch, &extra);
    if (major != COMP_MAJ || minor != COMP_MIN || patch != COMP_PATCH ||
        strcmp (extra, compextra))
    {
        std::cerr << "ERROR testing library, wrong library version: '" << major
                  << "." << minor << "." << patch;
        if (extra[0] != '\0') std::cerr << extra;
        std::cerr << "' vs compiled in '" << COMP_MAJ << "." << COMP_MIN << "."
                  << COMP_PATCH;
        if (compextra[0] != '\0') std::cerr << compextra;
        std::cerr << "'" << std::endl;
        EXRCORE_TEST (false);
    }
    std::cout << "Testing OpenEXR library version: '" << major << "." << minor
              << "." << patch;
    if (extra[0] != '\0') std::cout << extra;
    std::cout << "'" << std::endl;

    exr_get_library_version (NULL, &minor, &patch, &extra);
    exr_get_library_version (&major, NULL, &patch, &extra);
    exr_get_library_version (&major, &minor, NULL, &extra);
    exr_get_library_version (&major, &minor, &patch, NULL);

    major = (OPENEXR_VERSION_HEX >> 24) & 0xff;
    minor = (OPENEXR_VERSION_HEX >> 16) & 0xff;
    patch = (OPENEXR_VERSION_HEX >> 8) & 0xff;

    EXRCORE_TEST (major == COMP_MAJ);
    EXRCORE_TEST (minor == COMP_MIN);
    EXRCORE_TEST (patch == COMP_PATCH);

#if OPENEXR_VERSION_HEX > 0
    // confirm the macro compiles in an #if
#endif
}